

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_CollapseExpandRound2
              (sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit,int fOnOffSetLit)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  vTemp->nSize = 0;
  if (0 < vLits->nSize) {
    lVar4 = 0;
    do {
      if (vLits->pArray[lVar4] != -1) {
        Vec_IntPush(vTemp,vLits->pArray[lVar4]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLits->nSize);
  }
  if (vTemp->nSize < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x16c,
                  "int Bmc_CollapseExpandRound2(sat_solver *, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  if (fOnOffSetLit < 0) {
    iVar2 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
    if (vTemp->nSize < iVar2) goto LAB_00583454;
    vTemp->nSize = iVar2;
  }
  else {
    sat_solver_push(pSat,fOnOffSetLit);
    iVar2 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
    if (vTemp->nSize < iVar2) {
LAB_00583454:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vTemp->nSize = iVar2;
    sat_solver_pop(pSat);
  }
  if (0 < vLits->nSize) {
    piVar1 = vLits->pArray;
    lVar4 = 0;
    do {
      iVar2 = piVar1[lVar4];
      if (iVar2 != -1) {
        if (0 < (long)vTemp->nSize) {
          lVar3 = 0;
          do {
            if (vTemp->pArray[lVar3] == iVar2) goto LAB_00583418;
            lVar3 = lVar3 + 1;
          } while (vTemp->nSize != lVar3);
        }
        piVar1[lVar4] = -1;
      }
LAB_00583418:
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLits->nSize);
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpandRound2( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit, int fOnOffSetLit )
{
    // put into new array
    int i, iLit, nLits;
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 )
            Vec_IntPush( vTemp, iLit );
    assert( Vec_IntSize(vTemp) > 0 );
    // assume condition literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_push( pSat, fOnOffSetLit );
    // minimize
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTemp), Vec_IntSize(vTemp), nBTLimit );
    Vec_IntShrink( vTemp, nLits );
    // assume conditional literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_pop( pSat );
    // modify output literas
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 && Vec_IntFind(vTemp, iLit) == -1 )
            Vec_IntWriteEntry( vLits, i, -1 );
    return 0;
}